

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O2

int Ivy_ManPropagateBuffers(Ivy_Man_t *p,int fUpdateLevel)

{
  int iVar1;
  int iVar2;
  Ivy_Obj_t *pLatch;
  long lVar3;
  uint uVar4;
  uint uVar5;
  
  iVar1 = p->nObjs[6] + p->nObjs[5];
  uVar5 = iVar1 * 100;
  uVar4 = 0;
  do {
    lVar3 = (long)p->vBufs->nSize;
    if (lVar3 < 1) {
      return uVar4;
    }
    for (pLatch = (Ivy_Obj_t *)p->vBufs->pArray[lVar3 + -1];
        (*(uint *)&pLatch->field_0x8 & 0xf) == 7; pLatch = Ivy_ObjReadFirstFanout(p,pLatch)) {
    }
    iVar2 = Ivy_ManLatchIsSelfFeed(pLatch);
    if (iVar2 == 0) {
      Ivy_NodeFixBufferFanins(p,pLatch,fUpdateLevel);
      if (uVar4 != uVar5 && SBORROW4(uVar4,uVar5) == (int)(uVar4 + iVar1 * -100) < 0) {
        printf("Structural hashing is not finished after %d forward latch moves.\n",(ulong)uVar5);
        puts("This circuit cannot be forward-retimed completely. Quitting.");
        return uVar4;
      }
    }
    else {
      iVar2 = p->vBufs->nSize;
      if (iVar2 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x2cc,"void *Vec_PtrPop(Vec_Ptr_t *)");
      }
      p->vBufs->nSize = iVar2 + -1;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

int Ivy_ManPropagateBuffers( Ivy_Man_t * p, int fUpdateLevel )
{
    Ivy_Obj_t * pNode;
    int LimitFactor = 100;
    int NodeBeg = Ivy_ManNodeNum(p);
    int nSteps;
    for ( nSteps = 0; Vec_PtrSize(p->vBufs) > 0; nSteps++ )
    {
        pNode = (Ivy_Obj_t *)Vec_PtrEntryLast(p->vBufs);
        while ( Ivy_ObjIsBuf(pNode) )
            pNode = Ivy_ObjReadFirstFanout( p, pNode );
        // check if this buffer should remain
        if ( Ivy_ManLatchIsSelfFeed(pNode) )
        {
            Vec_PtrPop(p->vBufs);
            continue;
        }
//printf( "Propagating buffer %d with input %d and output %d\n", Ivy_ObjFaninId0(pNode), Ivy_ObjFaninId0(Ivy_ObjFanin0(pNode)), pNode->Id );
//printf( "Latch num %d\n", Ivy_ManLatchNum(p) );
        Ivy_NodeFixBufferFanins( p, pNode, fUpdateLevel );
        if ( nSteps > NodeBeg * LimitFactor )
        {
            printf( "Structural hashing is not finished after %d forward latch moves.\n", NodeBeg * LimitFactor );
            printf( "This circuit cannot be forward-retimed completely. Quitting.\n" );
            break;
        }
    }
//    printf( "Number of steps = %d. Nodes beg = %d. Nodes end = %d.\n", nSteps, NodeBeg, Ivy_ManNodeNum(p) );
    return nSteps;
}